

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O0

uint __thiscall wasm::ShellExternalInterface::Memory::get<unsigned_int>(Memory *this,size_t address)

{
  bool bVar1;
  reference address_00;
  uint *puVar2;
  uint loaded;
  size_t address_local;
  Memory *this_local;
  
  address_00 = std::vector<char,_std::allocator<char>_>::operator[](&this->memory,address);
  bVar1 = aligned<unsigned_int>(address_00);
  if (bVar1) {
    puVar2 = (uint *)std::vector<char,_std::allocator<char>_>::operator[](&this->memory,address);
    this_local._4_4_ = *puVar2;
  }
  else {
    puVar2 = (uint *)std::vector<char,_std::allocator<char>_>::operator[](&this->memory,address);
    this_local._4_4_ = *puVar2;
  }
  return this_local._4_4_;
}

Assistant:

T get(size_t address) {
      if (aligned<T>(&memory[address])) {
        return *reinterpret_cast<T*>(&memory[address]);
      } else {
        T loaded;
        std::memcpy(&loaded, &memory[address], sizeof(T));
        return loaded;
      }
    }